

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::AOIntegrator::Li
          (AOIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,SamplerHandle *sampler
          ,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  Float FVar1;
  undefined1 auVar2 [32];
  ulong uVar3;
  ushort uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  HaltonSampler *this_00;
  DebugMLTSampler *this_01;
  undefined1 auVar10 [16];
  long in_FS_OFFSET;
  undefined1 in_ZmmResult [64];
  undefined1 auVar9 [16];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar16 [48];
  undefined1 auVar14 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar17;
  undefined1 auVar21 [16];
  undefined8 uVar18;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined1 auVar32 [56];
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar31 [64];
  float fVar33;
  undefined8 uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar37 [56];
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  SampledSpectrum SVar44;
  BSDF bsdf;
  DispatchSplit<7> local_399;
  undefined1 local_398 [16];
  Tuple3<pbrt::Vector3,_float> local_388;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  PrimitiveHandle *local_360;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  SampledWavelengths *local_310;
  undefined1 (*local_308) [32];
  undefined1 (*local_300) [32];
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_2f8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  anon_struct_8_0_00000001_for___align local_2b8;
  float fStack_2b0;
  float local_2ac;
  undefined1 auStack_2a8 [12];
  MediumHandle local_298;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_288;
  undefined8 local_188;
  undefined1 local_178 [152];
  Tuple3<pbrt::Vector3,_float> aTStack_e0 [2];
  Tuple3<pbrt::Normal3,_float> TStack_c8;
  int iStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [40];
  Float local_80;
  char local_78;
  BSDF local_68;
  undefined1 auVar12 [64];
  undefined1 auVar15 [64];
  undefined1 auVar30 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 auVar36 [64];
  
  local_360 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_78 = '\0';
  local_308 = (undefined1 (*) [32])local_a8;
  local_300 = (undefined1 (*) [32])(local_288.__data + 0xd0);
  local_310 = lambda;
  do {
    *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
    if (((local_360->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
      local_188 = 0;
      local_288._64_8_ = 0;
      local_288._136_8_ = 0;
      local_288._144_8_ = 0;
      local_288._152_8_ = 0;
      local_288._160_8_ = 0;
      local_288._168_8_ = 0;
      local_288._176_8_ = 0;
      local_288._184_8_ = 0;
      local_288._80_48_ = (undefined1  [48])0x0;
      local_288._0_64_ = in_ZmmResult;
      local_288._72_8_ = local_288._136_8_;
      local_288._128_8_ = local_288._64_8_;
      local_288._192_64_ = in_ZmmResult;
    }
    else {
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_288.__align,local_360,&ray->super_Ray,
                 INFINITY);
    }
    if (local_78 == '\x01') {
      local_78 = '\0';
    }
    if ((char)local_188 == '\x01') {
      in_ZmmResult._48_8_ = local_288._128_8_;
      in_ZmmResult._0_48_ = local_288._80_48_;
      in_ZmmResult._56_8_ = local_288._136_8_;
      local_178._64_8_ = local_288._64_8_;
      local_178._72_8_ = local_288._72_8_;
      local_178._0_8_ = local_288.__align;
      local_178._8_8_ = local_288._8_8_;
      local_178._16_8_ = local_288._16_8_;
      local_178._24_8_ = local_288._24_8_;
      local_178._32_8_ = local_288._32_8_;
      local_178._40_8_ = local_288._40_8_;
      local_178._48_8_ = local_288._48_8_;
      local_178._56_8_ = local_288._56_8_;
      auVar2 = *local_300;
      local_178._144_8_ = local_288._144_8_;
      aTStack_e0[0].x = (float)local_288._152_4_;
      aTStack_e0[0].y = (float)local_288._156_4_;
      aTStack_e0[0].z = (float)local_288._160_4_;
      aTStack_e0[1].x = (float)local_288._164_4_;
      aTStack_e0[1].y = (float)local_288._168_4_;
      aTStack_e0[1].z = (float)local_288._172_4_;
      TStack_c8.x = (float)local_288._176_4_;
      TStack_c8.y = (float)local_288._180_4_;
      TStack_c8.z = (float)local_288._184_4_;
      iStack_bc = local_288._188_4_;
      local_b8 = local_288._192_16_;
      *(undefined8 *)local_308[1] = *(undefined8 *)local_300[1];
      *local_308 = auVar2;
      local_80 = (Float)local_288._248_4_;
      local_78 = '\x01';
      local_178._80_64_ = in_ZmmResult;
    }
    else if (local_78 == '\0') {
      uVar34 = 0;
      uVar18 = 0;
      goto LAB_003f10e6;
    }
    local_2f0.bits =
         (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_2f8.bits =
         (sampler->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    SurfaceInteraction::GetBSDF
              (&local_68,(SurfaceInteraction *)local_178,ray,lambda,(CameraHandle *)&local_2f0,
               scratchBuffer,(SamplerHandle *)&local_2f8);
    auVar16 = in_ZmmResult._16_48_;
    if (((ulong)local_68.bxdf.
                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                .bits & 0xffffffffffff) == 0) {
      if (local_78 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
      }
      SurfaceInteraction::SkipIntersection((SurfaceInteraction *)local_178,ray,local_80);
      iVar8 = 2;
    }
    else {
      fVar17 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      local_338._8_8_ = 0;
      local_338._0_8_ = local_178._40_8_;
      auVar10 = vmovshdup_avx(local_338);
      local_328 = ZEXT416((uint)local_178._48_4_);
      auVar35 = ZEXT416((uint)((float)local_178._48_4_ * -fVar17));
      auVar10 = vfnmadd132ss_fma(auVar10,auVar35,
                                 ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>
                                               .y));
      auVar35 = vfnmsub213ss_fma(ZEXT416((uint)fVar17),local_328,auVar35);
      auVar10 = vfnmadd132ss_fma(local_338,ZEXT416((uint)(auVar10._0_4_ + auVar35._0_4_)),
                                 ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>
                                               .x));
      local_348._0_4_ = auVar10._0_4_;
      if (auVar10._0_4_ < 0.0) {
        local_338._0_8_ = local_178._40_8_ ^ 0x8000000080000000;
        local_338._8_4_ = 0x80000000;
        local_338._12_4_ = 0x80000000;
      }
      local_388.x = 0.0;
      local_388.y = 0.0;
      local_388.z = 0.0;
      uVar3 = (sampler->
              super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
      uVar4 = (ushort)(uVar3 >> 0x30);
      uVar6 = (uint)uVar4;
      if (uVar3 >> 0x30 < 5) {
        if (uVar6 < 3) {
          if (uVar6 == 2) {
            auVar22._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar3 & 0xffffffffffff));
            auVar22._8_56_ = extraout_var_01;
            auVar10 = auVar22._0_16_;
          }
          else {
            auVar26._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar3 & 0xffffffffffff));
            auVar26._8_56_ = extraout_var_04;
            auVar10 = auVar26._0_16_;
          }
        }
        else {
          this_00 = (HaltonSampler *)(uVar3 & 0xffffffffffff);
          if ((uVar6 & 6) == 2) {
            iVar8 = this_00->dimension;
            if (0x3e6 < this_00->dimension) {
              iVar8 = 2;
            }
            this_00->dimension = iVar8 + 2;
            local_398._0_4_ = HaltonSampler::SampleDimension(this_00,iVar8);
            lambda = local_310;
            local_398._4_4_ = extraout_XMM0_Db;
            local_398._8_4_ = extraout_XMM0_Dc;
            local_398._12_4_ = extraout_XMM0_Dd;
            auVar24._0_4_ = HaltonSampler::SampleDimension(this_00,iVar8 + 1);
            auVar24._4_60_ = extraout_var;
            auVar10 = auVar24._0_16_;
LAB_003f10ad:
            auVar10 = vinsertps_avx(local_398,auVar10,0x10);
          }
          else {
            auVar28._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_00);
            auVar28._8_56_ = extraout_var_06;
            auVar10 = auVar28._0_16_;
          }
        }
      }
      else {
        uVar7 = uVar4 - 4;
        if (uVar7 < 3) {
          if (uVar7 == 2) {
            auVar23._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)(uVar3 & 0xffffffffffff));
            auVar23._8_56_ = extraout_var_02;
            auVar10 = auVar23._0_16_;
          }
          else {
            auVar27._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar3 & 0xffffffffffff));
            auVar27._8_56_ = extraout_var_05;
            auVar10 = auVar27._0_16_;
          }
        }
        else if (uVar6 - 6 < 2) {
          auVar25._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar3 & 0xffffffffffff));
          auVar25._8_56_ = extraout_var_03;
          auVar10 = auVar25._0_16_;
        }
        else {
          this_01 = (DebugMLTSampler *)(uVar3 & 0xffffffffffff);
          if (uVar6 - 6 != 2) {
            local_398._0_4_ = DebugMLTSampler::Get1D(this_01);
            local_398._4_4_ = extraout_XMM0_Db_00;
            local_398._8_4_ = extraout_XMM0_Dc_00;
            local_398._12_4_ = extraout_XMM0_Dd_00;
            auVar31._0_4_ = DebugMLTSampler::Get1D(this_01);
            auVar31._4_60_ = extraout_var_00;
            auVar10 = auVar31._0_16_;
            goto LAB_003f10ad;
          }
          auVar29._0_8_ = MLTSampler::Get2D((MLTSampler *)this_01);
          auVar29._8_56_ = extraout_var_07;
          auVar10 = auVar29._0_16_;
        }
      }
      auVar35 = ZEXT816(0) << 0x40;
      fVar17 = auVar10._0_4_;
      if (this->cosSample == true) {
        auVar19._0_4_ = fVar17 + fVar17;
        auVar19._4_4_ = auVar10._4_4_ + auVar10._4_4_;
        auVar19._8_4_ = auVar10._8_4_ + auVar10._8_4_;
        auVar19._12_4_ = auVar10._12_4_ + auVar10._12_4_;
        auVar10._8_4_ = 0xbf800000;
        auVar10._0_8_ = 0xbf800000bf800000;
        auVar10._12_4_ = 0xbf800000;
        in_ZmmResult._0_16_ = vaddps_avx512vl(auVar19,auVar10);
        in_ZmmResult._16_48_ = auVar16;
        fVar39 = in_ZmmResult._0_4_;
        auVar19 = vmovshdup_avx(in_ZmmResult._0_16_);
        fVar17 = auVar19._0_4_;
        if (fVar39 == 0.0) {
          auVar10 = ZEXT816(0) << 0x40;
          if ((fVar17 != 0.0) || (NAN(fVar17))) goto LAB_003f0ce5;
        }
        else {
LAB_003f0ce5:
          auVar35._8_4_ = 0x7fffffff;
          auVar35._0_8_ = 0x7fffffff7fffffff;
          auVar35._12_4_ = 0x7fffffff;
          auVar9 = vandps_avx512vl(in_ZmmResult._0_16_,auVar35);
          auVar20._0_4_ = fVar39 / fVar17;
          auVar20._4_12_ = in_ZmmResult._4_12_;
          auVar10 = vshufps_avx(auVar9,auVar9,0xf5);
          auVar35 = vfmadd132ss_fma(auVar20,SUB6416(ZEXT464(0x3fc90fdb),0),ZEXT416(0xbf490fdb));
          bVar5 = auVar10._0_4_ < auVar9._0_4_;
          auVar12._16_48_ = auVar16;
          auVar12._0_16_ = auVar35;
          auVar11._4_60_ = auVar12._4_60_;
          auVar11._0_4_ =
               (float)((uint)bVar5 * (int)((fVar17 / fVar39) * 0.7853982) +
                      (uint)!bVar5 * auVar35._0_4_);
          local_358 = auVar11._0_16_;
          auVar13._16_48_ = auVar16;
          auVar13._0_16_ = auVar19;
          in_ZmmResult._4_60_ = auVar13._4_60_;
          in_ZmmResult._0_4_ = (uint)bVar5 * (int)fVar39 + (uint)!bVar5 * (int)fVar17;
          local_398 = in_ZmmResult._0_16_;
          fVar17 = cosf(auVar11._0_4_);
          local_378._0_4_ = fVar17;
          fVar17 = sinf((float)local_358._0_4_);
          auVar35 = ZEXT816(0) << 0x40;
          auVar10 = vinsertps_avx(ZEXT416((uint)((float)local_398._0_4_ * (float)local_378._0_4_)),
                                  ZEXT416((uint)((float)local_398._0_4_ * fVar17)),0x10);
        }
        auVar16 = in_ZmmResult._16_48_;
        auVar9 = vfnmadd213ss_fma(auVar10,auVar10,ZEXT416(0x3f800000));
        auVar19 = vmovshdup_avx(auVar10);
        fVar17 = auVar19._0_4_;
        auVar19 = vfnmadd231ss_fma(auVar9,auVar19,auVar19);
        auVar19 = vmaxss_avx(auVar19,auVar35);
        auVar19 = vsqrtss_avx(auVar19,auVar19);
        fVar39 = auVar19._0_4_ * 0.31830987;
        if ((fVar39 == 0.0) && (!NAN(fVar39))) {
          local_2e8 = ZEXT816(0) << 0x20;
          iVar8 = 1;
          local_2d8 = local_2e8;
          goto LAB_003f108c;
        }
        local_398._0_4_ = fVar39;
      }
      else {
        auVar35 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar17 * fVar17)),auVar35);
        auVar19 = vsqrtss_avx(auVar35,auVar35);
        auVar35 = vmovshdup_avx(auVar10);
        fVar17 = auVar35._0_4_ * 6.2831855;
        local_358._0_4_ = fVar17;
        _local_378 = auVar10;
        local_398._0_4_ = auVar19._0_4_;
        fVar17 = cosf(fVar17);
        local_2c8 = ZEXT416((uint)(fVar17 * (float)local_398._0_4_));
        fVar17 = sinf((float)local_358._0_4_);
        fVar17 = fVar17 * (float)local_398._0_4_;
        auVar35 = ZEXT816(0) << 0x40;
        local_398._0_4_ = 0x3e22f983;
        auVar19 = _local_378;
        auVar10 = local_2c8;
      }
      uVar18 = vcmpss_avx512f(auVar35,ZEXT416((uint)local_348._0_4_),0xe);
      bVar5 = (bool)((byte)uVar18 & 1);
      auVar9._8_4_ = 0x3f800000;
      auVar9._0_8_ = 0x3f8000003f800000;
      auVar9._12_4_ = 0x3f800000;
      auVar40._8_4_ = 0x80000000;
      auVar40._0_8_ = 0x8000000080000000;
      auVar40._12_4_ = 0x80000000;
      local_348 = vmovshdup_avx(local_338);
      fVar42 = local_348._0_4_;
      auVar15._16_48_ = auVar16;
      auVar15._0_16_ = local_328;
      auVar14._4_60_ = auVar15._4_60_;
      auVar14._0_4_ =
           (float)((uint)bVar5 * (local_328._0_4_ ^ 0x80000000) + (uint)!bVar5 * local_328._0_4_);
      local_328 = auVar14._0_16_;
      in_ZmmResult._0_16_ = vpternlogd_avx512vl(auVar9,local_328,auVar40,0xf8);
      in_ZmmResult._16_48_ = auVar16;
      fVar33 = in_ZmmResult._0_4_;
      fVar41 = local_338._0_4_;
      fVar38 = -1.0 / (auVar14._0_4_ + fVar33);
      auVar35 = vfmadd213ss_fma(ZEXT416((uint)(fVar41 * fVar41 * fVar33)),ZEXT416((uint)fVar38),
                                auVar9);
      fVar39 = fVar41 * fVar42 * fVar38;
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar42 * fVar42)),ZEXT416((uint)fVar38),
                               in_ZmmResult._0_16_);
      fVar43 = auVar10._0_4_;
      fVar38 = auVar19._0_4_;
      local_388.z = auVar14._0_4_ * fVar38 + (fVar43 * fVar41 * -fVar33 - fVar42 * fVar17);
      auVar10 = vinsertps_avx(ZEXT416((uint)(fVar41 * fVar38 +
                                            fVar43 * auVar35._0_4_ + fVar39 * fVar17)),
                              ZEXT416((uint)(fVar42 * fVar38 +
                                            fVar43 * fVar33 * fVar39 + auVar9._0_4_ * fVar17)),0x10)
      ;
      local_388._0_8_ = vmovlps_avx(auVar10);
      Interaction::SpawnRay
                ((RayDifferential *)&local_288.__align,(Interaction *)local_178,
                 (Vector3f *)&local_388);
      auVar32 = local_288._8_56_;
      auVar16 = in_ZmmResult._16_48_;
      auVar37 = ZEXT856(local_288._20_8_);
      auStack_2a8 = local_288._16_12_;
      local_2b8 = local_288.__align;
      fStack_2b0 = local_288._8_4_;
      local_2ac = local_288._12_4_;
      local_298.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )local_288._32_8_;
      FVar1 = this->maxDist;
      *(long *)(in_FS_OFFSET + -0x2a8) = *(long *)(in_FS_OFFSET + -0x2a8) + 1;
      local_288._8_56_ = auVar32;
      if (((this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate.
           super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
           .bits & 0xffffffffffff) != 0) {
        auVar37 = ZEXT856(local_288._20_8_);
        bVar5 = PrimitiveHandle::IntersectP(local_360,(Ray *)&local_2b8,FVar1);
        auVar16 = in_ZmmResult._16_48_;
        iVar8 = 0;
        if (bVar5) goto LAB_003f108c;
      }
      FVar1 = this->illumScale;
      local_378._4_4_ = FVar1;
      local_378._0_4_ = FVar1;
      fStack_370 = FVar1;
      fStack_36c = FVar1;
      auVar32 = ZEXT856(local_378._8_8_);
      local_288.__align =
           (anon_struct_8_0_00000001_for___align)
           (this->illuminant).
           super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           .bits;
      SVar44 = DispatchSplit<7>::operator()
                         (&local_399,lambda,&local_288,(ulong)local_288.__align >> 0x30);
      auVar36._0_8_ = SVar44.values.values._8_8_;
      auVar36._8_56_ = auVar37;
      auVar30._0_8_ = SVar44.values.values._0_8_;
      auVar30._8_56_ = auVar32;
      auVar35 = vmovlhps_avx(auVar30._0_16_,auVar36._0_16_);
      iVar8 = 1;
      auVar19 = ZEXT416((uint)(local_328._0_4_ * local_388.z));
      auVar10 = vfmadd132ss_fma(local_348,auVar19,ZEXT416((uint)local_388.y));
      auVar19 = vfmsub213ss_fma(ZEXT416((uint)local_388.z),local_328,auVar19);
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ + auVar19._0_4_)),local_338,
                                ZEXT416((uint)local_388.x));
      fVar17 = auVar10._0_4_ / ((float)local_398._0_4_ * 3.1415927);
      auVar10 = *(undefined1 (*) [16])(lambda->pdf).values;
      uVar3 = vcmpps_avx512vl(auVar10,_DAT_0054e010,4);
      auVar21._0_4_ = fVar17 * auVar35._0_4_ * (float)local_378._0_4_;
      auVar21._4_4_ = fVar17 * auVar35._4_4_ * (float)local_378._4_4_;
      auVar21._8_4_ = fVar17 * auVar35._8_4_ * fStack_370;
      auVar21._12_4_ = fVar17 * auVar35._12_4_ * fStack_36c;
      auVar10 = vdivps_avx512vl(auVar21,auVar10);
      local_2e8._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar10._4_4_;
      local_2e8._0_4_ = (uint)((byte)uVar3 & 1) * auVar10._0_4_;
      local_2e8._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar10._8_4_;
      local_2e8._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar10._12_4_;
      in_ZmmResult._16_48_ = auVar16;
      in_ZmmResult._0_16_ = local_2e8;
      local_2d8 = vshufpd_avx(local_2e8,local_2e8,1);
    }
LAB_003f108c:
  } while (iVar8 == 2);
  uVar18 = 0;
  uVar34 = 0;
  if (iVar8 != 0) {
    uVar18 = local_2e8._0_8_;
    uVar34 = local_2d8._0_8_;
  }
LAB_003f10e6:
  SVar44.values.values[2] = (float)(int)uVar34;
  SVar44.values.values[3] = (float)(int)((ulong)uVar34 >> 0x20);
  SVar44.values.values[0] = (float)(int)uVar18;
  SVar44.values.values[1] = (float)(int)((ulong)uVar18 >> 0x20);
  return (SampledSpectrum)SVar44.values.values;
}

Assistant:

SampledSpectrum AOIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                 SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                 VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f);

    // Intersect _ray_ with scene and store intersection in _isect_
    pstd::optional<ShapeIntersection> si;
retry:
    si = Intersect(ray);
    if (si) {
        SurfaceInteraction &isect = si->intr;
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            goto retry;
        }

        // Compute coordinate frame based on true geometry, not shading
        // geometry.
        Normal3f n = FaceForward(isect.n, -ray.d);
        Vector3f s = Normalize(isect.dpdu);
        Vector3f t = Cross(isect.n, s);

        Vector3f wi;
        Float pdf;
        Point2f u = sampler.Get2D();
        if (cosSample) {
            wi = SampleCosineHemisphere(u);
            pdf = CosineHemispherePDF(std::abs(wi.z));
        } else {
            wi = SampleUniformHemisphere(u);
            pdf = UniformHemispherePDF();
        }
        if (pdf == 0)
            return SampledSpectrum(0.);

        Frame f = Frame::FromZ(n);
        wi = f.FromLocal(wi);

        // Divide by pi so that fully visible is one.
        Ray r = isect.SpawnRay(wi);
        if (!IntersectP(r, maxDist)) {
            SampledSpectrum L = illumScale * illuminant.Sample(lambda) *
                                SampledSpectrum(Dot(wi, n) / (Pi * pdf));
            return SafeDiv(L, lambda.PDF());
        }
    }
    return SampledSpectrum(0.);
}